

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_helpers.hpp
# Opt level: O2

void ear::
     mask_write<Eigen::Matrix<double,_1,1,0,_1,1>&,Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,Eigen::Array<bool,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,1,0,_1,1>>
               (Matrix<double,__1,_1,_0,__1,_1> *out,
               CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,_const_Eigen::Array<bool,__1,_1,_0,__1,_1>_>
               *mask,Matrix<double,__1,_1,_0,__1,_1> *values)

{
  double dVar1;
  long lVar2;
  CoeffReturnType CVar3;
  CoeffReturnType pdVar4;
  Scalar *pSVar5;
  long index;
  long lVar6;
  long lVar7;
  long index_00;
  
  lVar7 = (mask->m_xpr->super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows;
  lVar2 = (values->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  _assert_impl((out->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows == lVar7,"in mask_write: out_size and mask_write must be the same length");
  if (lVar7 < 1) {
    lVar7 = 0;
  }
  index = 0;
  for (index_00 = 0; lVar7 != index_00; index_00 = index_00 + 1) {
    CVar3 = Eigen::
            DenseCoeffsBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,_const_Eigen::Array<bool,_-1,_1,_0,_-1,_1>_>,_0>
            ::operator[]((DenseCoeffsBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,_const_Eigen::Array<bool,__1,_1,_0,__1,_1>_>,_0>
                          *)mask,index_00);
    lVar6 = index;
    if (CVar3) {
      lVar6 = index + 1;
      pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)values,index
                         );
      dVar1 = *pdVar4;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)out,index_00
                         );
      *pSVar5 = dVar1;
    }
    index = lVar6;
  }
  _assert_impl(index == lVar2,
               "in mask_size: length of values must equal the number of entries in mask");
  return;
}

Assistant:

void mask_write(OutT &&out, const MaskT &mask, const ValuesT &values) {
    Eigen::Index out_size = out.size();
    Eigen::Index mask_size = mask.size();
    Eigen::Index values_size = values.size();

    ear_assert(
        out_size == mask_size,
        "in mask_write: out_size and mask_write must be the same length");

    Eigen::Index j = 0;
    for (Eigen::Index i = 0; i < mask_size; i++)
      if (mask[i]) vec_write(out, i, values[j++]);

    ear_assert(j == values_size,
               "in mask_size: length of values must equal the number of "
               "entries in mask");
  }